

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_stream_set_name(cubeb_stream_conflict *stm,char *stream_name)

{
  pa_operation *stream;
  cubeb_conflict *in_RSI;
  long *in_RDI;
  pa_operation *op;
  pa_operation *in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RDI[2] == 0)) {
    local_4 = -1;
  }
  else {
    (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
    stream = (*cubeb_pa_stream_set_name)
                       ((pa_stream *)in_RDI[2],(char *)in_RSI,rename_success,in_RDI);
    if (stream != (pa_operation *)0x0) {
      operation_wait(in_RSI,(pa_stream *)stream,in_stack_ffffffffffffffd8);
      (*cubeb_pa_operation_unref)(stream);
    }
    (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(*in_RDI + 0x10));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
pulse_stream_set_name(cubeb_stream * stm, char const * stream_name)
{
  if (!stm || !stm->output_stream) {
    return CUBEB_ERROR;
  }

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);

  pa_operation * op =
    WRAP(pa_stream_set_name)(stm->output_stream, stream_name, rename_success, stm);

  if (op) {
    operation_wait(stm->context, stm->output_stream, op);
    WRAP(pa_operation_unref)(op);
  }

  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  return CUBEB_OK;
}